

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::TestRegistry::registerTest(TestRegistry *this,TestCase *testCase)

{
  set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_> *this_00;
  pointer pcVar1;
  int iVar2;
  iterator iVar3;
  IColourImpl *pIVar4;
  ostream *os;
  string name;
  ostringstream oss;
  char *local_2f0;
  long local_2e8;
  char local_2e0 [16];
  string local_2d0;
  Colour local_2b0 [112];
  ios_base local_240 [264];
  TestCase local_138;
  
  pcVar1 = (testCase->super_TestCaseInfo).name._M_dataplus._M_p;
  local_2f0 = local_2e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2f0,pcVar1,
             pcVar1 + (testCase->super_TestCaseInfo).name._M_string_length);
  iVar2 = std::__cxx11::string::compare((char *)&local_2f0);
  if (iVar2 == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2b0,"Anonymous test case ",0x14);
    this->m_unnamedCount = this->m_unnamedCount + 1;
    std::ostream::_M_insert<unsigned_long>((ulong)local_2b0);
    std::__cxx11::stringbuf::str();
    TestCase::withName(&local_138,testCase,&local_2d0);
    (*(this->super_ITestCaseRegistry)._vptr_ITestCaseRegistry[4])(this,&local_138);
    TestCase::~TestCase(&local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      operator_delete(local_2d0._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
    std::ios_base::~ios_base(local_240);
  }
  else {
    this_00 = &this->m_functions;
    iVar3 = std::
            _Rb_tree<Catch::TestCase,_Catch::TestCase,_std::_Identity<Catch::TestCase>,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>
            ::find(&this_00->_M_t,testCase);
    if ((_Rb_tree_header *)iVar3._M_node != &(this->m_functions)._M_t._M_impl.super__Rb_tree_header)
    {
      iVar3 = std::
              _Rb_tree<Catch::TestCase,_Catch::TestCase,_std::_Identity<Catch::TestCase>,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>
              ::find(&this_00->_M_t,testCase);
      local_2b0[0].m_moved = false;
      pIVar4 = Colour::impl();
      (**(code **)(*(long *)pIVar4 + 0x10))(pIVar4,2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"error: TEST_CASE( \"",0x13);
      os = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,local_2f0,local_2e8);
      std::__ostream_insert<char,std::char_traits<char>>(os,"\" ) already defined.\n",0x15);
      std::__ostream_insert<char,std::char_traits<char>>(os,"\tFirst seen at ",0xf);
      operator<<(os,(SourceLineInfo *)(iVar3._M_node + 8));
      std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(os,"\tRedefined at ",0xe);
      operator<<(os,&(testCase->super_TestCaseInfo).lineInfo);
      std::endl<char,std::char_traits<char>>(os);
      Colour::~Colour(local_2b0);
      exit(1);
    }
    std::
    _Rb_tree<Catch::TestCase,Catch::TestCase,std::_Identity<Catch::TestCase>,std::less<Catch::TestCase>,std::allocator<Catch::TestCase>>
    ::_M_insert_unique<Catch::TestCase_const&>
              ((_Rb_tree<Catch::TestCase,Catch::TestCase,std::_Identity<Catch::TestCase>,std::less<Catch::TestCase>,std::allocator<Catch::TestCase>>
                *)this_00,testCase);
    std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::push_back
              (&this->m_functionsInOrder,testCase);
    if (((testCase->super_TestCaseInfo).properties & IsHidden) == None) {
      std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::push_back
                (&this->m_nonHiddenFunctions,testCase);
    }
  }
  if (local_2f0 != local_2e0) {
    operator_delete(local_2f0);
  }
  return;
}

Assistant:

virtual void registerTest( TestCase const& testCase ) {
            std::string name = testCase.getTestCaseInfo().name;
            if( name == "" ) {
                std::ostringstream oss;
                oss << "Anonymous test case " << ++m_unnamedCount;
                return registerTest( testCase.withName( oss.str() ) );
            }

            if( m_functions.find( testCase ) == m_functions.end() ) {
                m_functions.insert( testCase );
                m_functionsInOrder.push_back( testCase );
                if( !testCase.isHidden() )
                    m_nonHiddenFunctions.push_back( testCase );
            }
            else {
                TestCase const& prev = *m_functions.find( testCase );
                {
                    Colour colourGuard( Colour::Red );
                    std::cerr   << "error: TEST_CASE( \"" << name << "\" ) already defined.\n"
                                << "\tFirst seen at " << prev.getTestCaseInfo().lineInfo << "\n"
                                << "\tRedefined at " << testCase.getTestCaseInfo().lineInfo << std::endl;
                }
                exit(1);
            }
        }